

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int write_path_table(archive_write *a,int type_m,vdd *vdd)

{
  ulong uVar1;
  void *pvVar2;
  isoent **ppiVar3;
  isoent *piVar4;
  bool bVar5;
  undefined1 uVar9;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined1 uVar10;
  uint uVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong local_60;
  int local_54;
  long local_48;
  
  if (vdd->max_depth < 1) {
    iVar6 = 0;
    uVar15 = 0;
  }
  else {
    lVar14 = 0;
    uVar11 = 0;
    do {
      iVar8 = vdd->pathtbl[lVar14].cnt;
      iVar6 = 0;
      if (iVar8 != 0) {
        pvVar2 = a->format_data;
        local_48 = *(long *)((long)pvVar2 + 0x102e0);
        local_60 = (long)pvVar2 + (0x102dc - local_48);
        lVar12 = (long)pvVar2 + (0x102db - local_48);
        if (iVar8 < 1) {
          iVar8 = 0;
        }
        else {
          ppiVar3 = vdd->pathtbl[lVar14].sorted;
          lVar16 = 0;
          iVar8 = 0;
          do {
            piVar4 = ppiVar3[lVar16];
            if (piVar4->identifier == (char *)0x0) {
              uVar15 = 1;
            }
            else {
              uVar15 = (ulong)piVar4->id_len;
            }
            sVar13 = (lVar12 - local_60) + 1;
            uVar1 = uVar15 + 9;
            if (local_48 - sVar13 < uVar1) {
              iVar6 = wb_consume(a,sVar13);
              if (-1 < iVar6) {
                pvVar2 = a->format_data;
                local_48 = *(long *)((long)pvVar2 + 0x102e0);
                local_60 = (long)pvVar2 + (0x102dc - local_48);
                lVar12 = (long)pvVar2 + (0x102db - local_48);
                goto LAB_00148c81;
              }
              bVar5 = false;
              local_54 = iVar6;
            }
            else {
LAB_00148c81:
              *(char *)(lVar12 + 1) = (char)uVar15;
              *(undefined1 *)(lVar12 + 2) = 0;
              uVar7 = piVar4->dir_location;
              uVar9 = (undefined1)(uVar7 >> 8);
              uVar10 = (undefined1)(uVar7 >> 0x10);
              if (type_m == 0) {
                *(char *)(lVar12 + 3) = (char)uVar7;
                *(undefined1 *)(lVar12 + 4) = uVar9;
                *(undefined1 *)(lVar12 + 5) = uVar10;
                uVar7 = uVar7 >> 0x18;
              }
              else {
                *(char *)(lVar12 + 3) = (char)(uVar7 >> 0x18);
                *(undefined1 *)(lVar12 + 4) = uVar10;
                *(undefined1 *)(lVar12 + 5) = uVar9;
              }
              *(char *)(lVar12 + 6) = (char)uVar7;
              uVar7 = piVar4->parent->dir_number;
              if (type_m == 0) {
                *(char *)(lVar12 + 7) = (char)uVar7;
                uVar7 = uVar7 >> 8;
              }
              else {
                *(char *)(lVar12 + 7) = (char)(uVar7 >> 8);
              }
              *(char *)(lVar12 + 8) = (char)uVar7;
              if (piVar4->identifier == (char *)0x0) {
                *(undefined1 *)(lVar12 + 9) = 0;
              }
              else {
                memcpy((undefined1 *)(lVar12 + 9),piVar4->identifier,uVar15);
              }
              if ((uVar15 & 1) != 0) {
                uVar15 = uVar15 + 1;
                *(undefined1 *)(lVar12 + uVar1) = 0;
              }
              iVar8 = iVar8 + (int)uVar15 + 8;
              lVar12 = lVar12 + uVar15 + 8;
              bVar5 = true;
            }
            iVar6 = local_54;
            if (!bVar5) goto LAB_00148da0;
            lVar16 = lVar16 + 1;
          } while (lVar16 < vdd->pathtbl[lVar14].cnt);
        }
        sVar13 = (lVar12 + 1U) - local_60;
        if ((lVar12 + 1U < local_60 || sVar13 == 0) || (iVar6 = wb_consume(a,sVar13), -1 < iVar6)) {
          iVar6 = iVar8;
        }
      }
LAB_00148da0:
      if (iVar6 < 0) {
        return iVar6;
      }
      uVar11 = uVar11 + iVar6;
      lVar14 = lVar14 + 1;
    } while (lVar14 < vdd->max_depth);
    uVar15 = (ulong)(uVar11 & 0xfff);
  }
  if (uVar15 == 0) {
    return iVar6;
  }
  iVar6 = write_null(a,0x1000 - uVar15);
  return iVar6;
}

Assistant:

static int
write_path_table(struct archive_write *a, int type_m, struct vdd *vdd)
{
	int depth, r;
	size_t path_table_size;

	r = ARCHIVE_OK;
	path_table_size = 0;
	for (depth = 0; depth < vdd->max_depth; depth++) {
		r = _write_path_table(a, type_m, depth, vdd);
		if (r < 0)
			return (r);
		path_table_size += r;
	}

	/* Write padding data. */
	path_table_size = path_table_size % PATH_TABLE_BLOCK_SIZE;
	if (path_table_size > 0)
		r = write_null(a, PATH_TABLE_BLOCK_SIZE - path_table_size);
	return (r);
}